

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::processSubstitutionGroup
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          ComplexTypeInfo **typeInfo,DatatypeValidator **validator,XMLCh *subsElemQName)

{
  uint namespaceURI;
  DatatypeValidator *pDVar1;
  QName *pQVar2;
  XMLCh *key1;
  GrammarResolver *this_00;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this_01;
  DOMElement *elem_00;
  bool bVar3;
  int iVar4;
  SchemaElementDecl *subsElemDecl;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar5;
  undefined4 extraout_var;
  Grammar *pGVar6;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *toCopy;
  SchemaInfo *pSVar7;
  TraverseSchema *this_02;
  SchemaElementDecl *elemDecl_local;
  DOMElement *local_78;
  _func_int **local_70;
  BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo> importingEnum;
  NamespaceScopeManager nsMgr;
  
  elemDecl_local = elemDecl;
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  this_02 = this;
  local_78 = elem;
  subsElemDecl = getGlobalElemDecl(this,elem,subsElemQName);
  if (subsElemDecl == (SchemaElementDecl *)0x0) goto LAB_0031b8ee;
  bVar3 = isSubstitutionGroupCircular(this_02,elemDecl,subsElemDecl);
  if (bVar3) {
    reportSchemaError(this,local_78,(XMLCh *)XMLUni::fgXMLErrDomain,0x93,
                      ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,(XMLCh *)0x0,
                      (XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_0031b8ee;
  }
  bVar3 = isSubstitutionGroupValid
                    (this,local_78,subsElemDecl,*typeInfo,*validator,
                     ((elemDecl->super_XMLElementDecl).fElementName)->fLocalPart,true);
  if (!bVar3) goto LAB_0031b8ee;
  elemDecl->fSubstitutionGroupElem = subsElemDecl;
  if (*validator == (DatatypeValidator *)0x0 && *typeInfo == (ComplexTypeInfo *)0x0) {
    *typeInfo = subsElemDecl->fComplexTypeInfo;
    pDVar1 = subsElemDecl->fDatatypeValidator;
    *validator = pDVar1;
    if (pDVar1 == (DatatypeValidator *)0x0) {
      if (*typeInfo == (ComplexTypeInfo *)0x0) goto LAB_0031b6c5;
      elemDecl->fComplexTypeInfo = *typeInfo;
      iVar4 = (*typeInfo)->fContentType;
    }
    else {
      elemDecl->fDatatypeValidator = pDVar1;
      iVar4 = 5;
    }
    *(int *)&(elemDecl->super_XMLElementDecl).field_0x2c = iVar4;
  }
LAB_0031b6c5:
  pQVar2 = (subsElemDecl->super_XMLElementDecl).fElementName;
  key1 = pQVar2->fLocalPart;
  namespaceURI = pQVar2->fURIId;
  pVVar5 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
           ::get(this->fValidSubstitutionGroups,key1,namespaceURI);
  if (pVVar5 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
    if (this->fTargetNSURI != namespaceURI) {
      this_00 = this->fGrammarResolver;
      iVar4 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                        (this->fURIStringPool,(ulong)namespaceURI);
      pGVar6 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar4));
      if (pGVar6 != (Grammar *)0x0) {
        toCopy = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                 ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                        *)pGVar6[10].super_XSerializable._vptr_XSerializable,key1,namespaceURI);
        if (toCopy != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
          pVVar5 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                   XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(pVVar5,toCopy);
          RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
          ::put(this->fValidSubstitutionGroups,key1,namespaceURI,pVVar5);
          goto LAB_0031b7fe;
        }
        bVar3 = SchemaInfo::circularImportExist(this->fSchemaInfo,namespaceURI);
        if (bVar3) {
          this_01 = (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                     *)pGVar6[10].super_XSerializable._vptr_XSerializable;
          pVVar5 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
                   XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                    (pVVar5,8,this->fGrammarPoolMemoryManager,false);
          RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
          ::put(this_01,key1,namespaceURI,pVVar5);
        }
      }
    }
    pVVar5 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
             XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
              (pVVar5,8,this->fGrammarPoolMemoryManager,false);
    RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
    ::put(this->fValidSubstitutionGroups,key1,namespaceURI,pVVar5);
  }
LAB_0031b7fe:
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(pVVar5,&elemDecl_local);
  importingEnum.fToEnum =
       &this->fSchemaInfo->fImportingInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>;
  local_70 = (_func_int **)&PTR__BaseRefVectorEnumerator_00408218;
  importingEnum.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator =
       (_func_int **)&PTR__BaseRefVectorEnumerator_00408218;
  importingEnum.fAdopted = false;
  importingEnum.fCurIndex = 0;
  while (elem_00 = local_78, importingEnum.fCurIndex < (importingEnum.fToEnum)->fCurCount) {
    pSVar7 = BaseRefVectorEnumerator<xercesc_4_0::SchemaInfo>::nextElement(&importingEnum);
    pGVar6 = GrammarResolver::getGrammar(this->fGrammarResolver,pSVar7->fTargetNSURIString);
    pVVar5 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                    *)pGVar6[10].super_XSerializable._vptr_XSerializable,key1,namespaceURI);
    if ((pVVar5 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) &&
       (bVar3 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::containsElement
                          (pVVar5,&elemDecl_local,0), !bVar3)) {
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(pVVar5,&elemDecl_local);
    }
  }
  buildValidSubstitutionListB(this,local_78,elemDecl_local,subsElemDecl);
  buildValidSubstitutionListF(this,elem_00,elemDecl_local,subsElemDecl);
  importingEnum.super_XMLEnumerator<xercesc_4_0::SchemaInfo>._vptr_XMLEnumerator = local_70;
  if ((importingEnum.fAdopted == true) &&
     (importingEnum.fToEnum != (BaseRefVectorOf<xercesc_4_0::SchemaInfo> *)0x0)) {
    (*(importingEnum.fToEnum)->_vptr_BaseRefVectorOf[1])();
  }
LAB_0031b8ee:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return;
}

Assistant:

void TraverseSchema::processSubstitutionGroup(const DOMElement* const elem,
                                              SchemaElementDecl* const elemDecl,
                                              ComplexTypeInfo*& typeInfo,
                                              DatatypeValidator*& validator,
                                              const XMLCh* const subsElemQName)
{
    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaElementDecl* subsElemDecl = getGlobalElemDecl(elem, subsElemQName);
    if (subsElemDecl)
    {
        if (isSubstitutionGroupCircular(elemDecl, subsElemDecl))
        {
            reportSchemaError(
                elem , XMLUni::fgXMLErrDomain , XMLErrs::CircularSubsGroup, elemDecl->getBaseName());
        }
        else
        {
            // Check for substitution validity constraint
            // Substitution allowed (block and blockDefault) && same type
            if (isSubstitutionGroupValid(elem, subsElemDecl, typeInfo, validator, elemDecl->getBaseName()))
            {
                elemDecl->setSubstitutionGroupElem(subsElemDecl);

                // if type information is missing, use subsGroup one
                if (!typeInfo && !validator)
                {
                    typeInfo = subsElemDecl->getComplexTypeInfo();
                    validator = subsElemDecl->getDatatypeValidator();

                    if (validator)
                    {
                        elemDecl->setDatatypeValidator(validator);
                        elemDecl->setModelType(SchemaElementDecl::Simple);
                    }
                    else if (typeInfo)
                    {
                        elemDecl->setComplexTypeInfo(typeInfo);
                        elemDecl->setModelType((SchemaElementDecl::ModelTypes)typeInfo->getContentType());
                    }
                }

                XMLCh* subsElemBaseName = subsElemDecl->getBaseName();
                int    subsElemURI = subsElemDecl->getURI();
                ValueVectorOf<SchemaElementDecl*>* subsElements =
                    fValidSubstitutionGroups->get(subsElemBaseName, subsElemURI);

                if (!subsElements && fTargetNSURI != subsElemURI)
                {
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(subsElemURI));

                    if (aGrammar)
                    {
                        subsElements = aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                        if (subsElements)
                        {
                            subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*subsElements);
                            fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                        }
                        else if (fSchemaInfo->circularImportExist(subsElemURI))
                        {
                            aGrammar->getValidSubstitutionGroups()->put(
                            subsElemBaseName, subsElemURI, new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager));
                        }
                    }
                }

                if (!subsElements)
                {
                    subsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fGrammarPoolMemoryManager);
                    fValidSubstitutionGroups->put(subsElemBaseName, subsElemURI, subsElements);
                }

                subsElements->addElement(elemDecl);

                // update related subs. info in case of circular import
                BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

                while (importingEnum.hasMoreElements())
                {
                    const SchemaInfo& curRef = importingEnum.nextElement();
                    SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
                    ValueVectorOf<SchemaElementDecl*>* subsElemList =
                        aGrammar->getValidSubstitutionGroups()->get(subsElemBaseName, subsElemURI);

                    if (subsElemList && !subsElemList->containsElement(elemDecl))
                        subsElemList->addElement(elemDecl);
                }

                buildValidSubstitutionListB(elem, elemDecl, subsElemDecl);
                buildValidSubstitutionListF(elem, elemDecl, subsElemDecl);
            }
        }
    }
}